

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToCFFEmbeddedFontWriter.cpp
# Opt level: O3

void __thiscall
Type1ToCFFEmbeddedFontWriter::Type1ToCFFEmbeddedFontWriter(Type1ToCFFEmbeddedFontWriter *this)

{
  _Rb_tree_header *p_Var1;
  
  Type1Input::Type1Input(&this->mType1Input);
  InputFile::InputFile(&this->mType1File);
  CFFPrimitiveWriter::CFFPrimitiveWriter(&this->mPrimitivesWriter,(IByteWriter *)0x0);
  OutputStringBufferStream::OutputStringBufferStream(&this->mFontFileStream);
  (this->mStrings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mStrings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mStrings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->mNonStandardStringToIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->mNonStandardStringToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mNonStandardStringToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->mNonStandardStringToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mNonStandardStringToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mNonStandardStringToIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mCharset = (unsigned_short *)0x0;
  return;
}

Assistant:

Type1ToCFFEmbeddedFontWriter::Type1ToCFFEmbeddedFontWriter(void)
{
	mCharset = NULL;
}